

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIO.cpp
# Opt level: O0

void anon_unknown.dwarf_1ba98::testDeepTiledImage2(string *fileName)

{
  byte bVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  string *in_RDI;
  Image *img2;
  Header hdr2;
  Header hdr1;
  DeepImage img1;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffe50;
  allocator<char> *in_stack_fffffffffffffe70;
  Vec2<float> *this;
  Vec2<int> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Vec2<float> local_158;
  Header local_150 [56];
  TileDescription local_118;
  Vec2<float> local_108;
  TileDescription local_100 [4];
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [32];
  DeepImage local_70 [104];
  string *local_8;
  
  this_00 = (Vec2<int> *)(local_90 + 8);
  local_8 = in_RDI;
  Imath_3_2::Vec2<int>::Vec2(this_00,0,0);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
  Imath_3_2::Vec2<int>::Vec2((Vec2<int> *)this_01,5,5);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffe50,
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (Vec2<int> *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  Imf_3_2::DeepImage::DeepImage(local_70,(Box *)(local_90 + 0x10),ONE_LEVEL,ROUND_DOWN);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)this_00,in_stack_fffffffffffffe70);
  Imf_3_2::Image::insertChannel((string *)local_70,(PixelType)local_b0,1,1,true);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  this = &local_108;
  Imath_3_2::Vec2<float>::Vec2(this,0.0,0.0);
  Imf_3_2::Header::Header((Header *)0x3f800000,local_100,0x40,0x40,this,0,3);
  Imf_3_2::TileDescription::TileDescription(&local_118,0x20,0x20,ONE_LEVEL,ROUND_DOWN);
  Imf_3_2::Header::setTileDescription(local_100);
  Imf_3_2::saveImage(local_8,(Header *)local_100,(Image *)local_70,USE_IMAGE_DATA_WINDOW);
  Imath_3_2::Vec2<float>::Vec2(&local_158,0.0,0.0);
  Imf_3_2::Header::Header((Header *)0x3f800000,local_150,0x40,0x40,&local_158,0,3);
  plVar3 = (long *)Imf_3_2::loadImage(local_8,local_150);
  if (plVar3 == (long *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(plVar3,&Imf_3_2::Image::typeinfo,&Imf_3_2::DeepImage::typeinfo,0);
  }
  if (lVar4 == 0) {
    __assert_fail("dynamic_cast<DeepImage*> (img2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                  ,0xba,"void (anonymous namespace)::testDeepTiledImage2(const string &)");
  }
  iVar2 = Imf_3_2::Image::levelMode();
  if (iVar2 != 0) {
    __assert_fail("img2->levelMode () == ONE_LEVEL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                  ,0xbb,"void (anonymous namespace)::testDeepTiledImage2(const string &)");
  }
  iVar2 = Imf_3_2::Image::levelRoundingMode();
  if (iVar2 == 0) {
    bVar1 = Imf_3_2::Header::hasTileDescription();
    if ((bVar1 & 1) == 0) {
      __assert_fail("hdr2.hasTileDescription ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                    ,0xbd,"void (anonymous namespace)::testDeepTiledImage2(const string &)");
    }
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))();
    }
    Imf_3_2::Header::~Header(local_150);
    Imf_3_2::Header::~Header((Header *)local_100);
    Imf_3_2::DeepImage::~DeepImage(local_70);
    return;
  }
  __assert_fail("img2->levelRoundingMode () == ROUND_DOWN",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testIO.cpp"
                ,0xbc,"void (anonymous namespace)::testDeepTiledImage2(const string &)");
}

Assistant:

void
testDeepTiledImage2 (const string& fileName)
{
    DeepImage img1 (Box2i (V2i (0, 0), V2i (5, 5)), ONE_LEVEL, ROUND_DOWN);
    img1.insertChannel ("H", HALF);

    Header hdr1;
    hdr1.setTileDescription (TileDescription (32, 32));

    saveImage (fileName, hdr1, img1);

    Header hdr2;
    Image* img2 = loadImage (fileName, hdr2);

    assert (dynamic_cast<DeepImage*> (img2));
    assert (img2->levelMode () == ONE_LEVEL);
    assert (img2->levelRoundingMode () == ROUND_DOWN);
    assert (hdr2.hasTileDescription ());

    delete img2;
}